

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_combo_begin_image_text(nk_context *ctx,char *selected,int len,nk_image img,nk_vec2 size)

{
  nk_command_buffer *out;
  nk_vec2 nVar1;
  nk_window *win;
  nk_rect r;
  nk_widget_layout_states nVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  nk_context *i;
  int iVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_01;
  nk_rect b;
  nk_rect header_00;
  float local_e8;
  float fStack_e4;
  float local_d8;
  nk_text local_a8;
  nk_rect header;
  nk_rect local_50;
  nk_rect local_40;
  
  iVar7 = 0;
  iVar3 = 0;
  if (((ctx != (nk_context *)0x0) && (win = ctx->current, iVar3 = iVar7, win != (nk_window *)0x0))
     && (win->layout != (nk_panel *)0x0)) {
    nVar2 = nk_widget(&header,ctx);
    if (nVar2 != NK_WIDGET_INVALID) {
      i = ctx;
      if ((win->layout->flags & 0x800) != 0) {
        i = (nk_context *)0x0;
      }
      if (nVar2 == NK_WIDGET_ROM) {
        i = (nk_context *)0x0;
      }
      r.w = header.w;
      r.h = header.h;
      r.x = header.x;
      r.y = header.y;
      fVar11 = header.h;
      iVar3 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      uVar5 = (ctx->last_widget_state & 0x10) >> 4;
      bVar8 = (ctx->last_widget_state & 0x20) == 0;
      uVar4 = 0x1ad8;
      if (bVar8) {
        uVar4 = (ulong)(uVar5 << 5) | 0x1a98;
      }
      lVar6 = 0x1b04;
      if (bVar8) {
        lVar6 = (ulong)uVar5 * 4 + 0x1afc;
      }
      local_a8.text = *(nk_color *)((long)&(ctx->input).keyboard.keys[0].down + lVar6);
      if (*(int *)((long)&(ctx->input).keyboard.keys[0].down + uVar4) == 1) {
        local_a8.background.r = '\0';
        local_a8.background.g = '\0';
        local_a8.background.b = '\0';
        local_a8.background.a = '\0';
        r_00.w = header.w;
        r_00.h = header.h;
        r_00.x = header.x;
        r_00.y = header.y;
        nk_draw_image(&win->buffer,r_00,
                      (nk_image *)((long)&(ctx->input).keyboard.keys[1].down + uVar4),
                      (nk_color)0xffffffff);
      }
      else {
        local_a8.background = *(nk_color *)((long)&(ctx->input).keyboard.keys[1].down + uVar4);
        rect.w = header.w;
        rect.h = header.h;
        rect.x = header.x;
        rect.y = header.y;
        nk_fill_rect(&win->buffer,rect,(ctx->style).combo.rounding,local_a8.background);
        rect_00.w = header.w;
        rect_00.h = header.h;
        rect_00.x = header.x;
        rect_00.y = header.y;
        nk_stroke_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,(ctx->style).combo.border,
                       (ctx->style).combo.border_color);
      }
      lVar6 = 0x1bcc;
      if ((ctx->last_widget_state & 0x10) == 0) {
        lVar6 = (ulong)(iVar3 != 0) * 8 + 0x1bc8;
      }
      fVar9 = (ctx->style).combo.button_padding.y;
      local_e8 = header.x;
      fStack_e4 = header.y;
      local_40.y = fStack_e4 + fVar9;
      local_40.w = fVar11 - (fVar9 + fVar9);
      local_d8 = header.w;
      fVar12 = ((local_e8 + local_d8) - fVar11) - (ctx->style).combo.button_padding.x;
      nVar1 = (ctx->style).combo.button.padding;
      fVar9 = nVar1.x;
      fVar10 = nVar1.y;
      local_50.x = fVar12 + fVar9;
      local_50.y = local_40.y + fVar10;
      local_50.w = local_40.w - (fVar9 + fVar9);
      local_50.h = local_40.w - (fVar10 + fVar10);
      out = &win->buffer;
      local_40.x = fVar12;
      local_40.h = local_40.w;
      nk_draw_button_symbol
                (out,&local_40,&local_50,ctx->last_widget_state,&(ctx->style).combo.button,
                 *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar6),
                 (ctx->style).font);
      nVar1 = (ctx->style).combo.content_padding;
      fVar9 = nVar1.y;
      local_e8 = local_e8 + nVar1.x;
      r_01.w = fVar11 - (fVar9 + fVar9);
      r_01.y = fStack_e4 + fVar9;
      r_01.x = local_e8;
      r_01.h = r_01.w;
      nk_draw_image(out,r_01,&img,(nk_color)0xffffffff);
      local_a8.padding.x = 0.0;
      local_a8.padding.y = 0.0;
      nVar1 = (ctx->style).combo.content_padding;
      fVar9 = nVar1.x;
      fVar10 = nVar1.y;
      b.x = r_01.w + local_e8 + (ctx->style).combo.spacing.x + fVar9;
      b.y = fStack_e4 + fVar10;
      b.w = (fVar12 - fVar9) - b.x;
      b.h = fVar11 - (fVar10 + fVar10);
      nk_widget_text(out,b,selected,len,&local_a8,0x11,(ctx->style).font);
      header_00.w = header.w;
      header_00.h = header.h;
      header_00.x = header.x;
      header_00.y = header.y;
      iVar3 = nk_combo_begin(ctx,win,size,(uint)(iVar3 != 0),header_00);
    }
  }
  return iVar3;
}

Assistant:

NK_API int
nk_combo_begin_image_text(struct nk_context *ctx, const char *selected, int len,
    struct nk_image img, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (!s) return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        text.text = style->combo.label_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        text.text = style->combo.label_hover;
    } else {
        background = &style->combo.normal;
        text.text = style->combo.label_normal;
    }
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        text.background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        text.background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect content;
        struct nk_rect button;
        struct nk_rect label;
        struct nk_rect image;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);

        /* draw image */
        image.x = header.x + style->combo.content_padding.x;
        image.y = header.y + style->combo.content_padding.y;
        image.h = header.h - 2 * style->combo.content_padding.y;
        image.w = image.h;
        nk_draw_image(&win->buffer, image, &img, nk_white);

        /* draw label */
        text.padding = nk_vec2(0,0);
        label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
        label.y = header.y + style->combo.content_padding.y;
        label.w = (button.x - style->combo.content_padding.x) - label.x;
        label.h = header.h - 2 * style->combo.content_padding.y;
        nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}